

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keytap2.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  t1;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  t1_00;
  bool bVar1;
  uint uVar2;
  time_t tVar3;
  size_type sVar4;
  int32_t extraout_var;
  reference pvVar5;
  reference this;
  reference pvVar6;
  reference psVar7;
  undefined8 *in_RSI;
  int in_EDI;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  string *unaff_retaddr;
  TWaveformT<short> *in_stack_00000010;
  string *in_stack_00000018;
  bool in_stack_00000057;
  int in_stack_00000058;
  int in_stack_0000005c;
  TClusterId *cid_1;
  stKeyPressData<short> *k_2;
  iterator __end1_2;
  iterator __begin1_2;
  TKeyPressCollection *__range1_2;
  TClusterId *cid;
  stKeyPressData<short> *k_1;
  iterator __end1_1;
  iterator __begin1_1;
  TKeyPressCollection *__range1_1;
  TValueCC cc;
  int j_1;
  int i_1;
  int j;
  TValueCC *avgcc;
  int i;
  int n;
  time_point tEnd_1;
  time_point tStart_1;
  TSimilarityMap similarityMap;
  TKeyPressPosition *pos;
  stKeyPressData<short> *k;
  iterator __end1;
  iterator __begin1;
  TKeyPressCollection *__range1;
  time_point tEnd;
  time_point tStart;
  TWaveform waveformMax;
  TWaveform waveformThreshold;
  TKeyPressCollection keyPresses;
  TWaveform waveformInput;
  int64_t sampleRate;
  undefined4 in_stack_fffffffffffffdb8;
  undefined4 uVar12;
  undefined4 in_stack_fffffffffffffdbc;
  stKeyPressCollection<short> *in_stack_fffffffffffffdc0;
  undefined4 in_stack_fffffffffffffdc8;
  undefined4 in_stack_fffffffffffffdcc;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  in_stack_fffffffffffffdd0;
  undefined4 in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffdf4;
  float fVar13;
  undefined4 in_stack_fffffffffffffdf8;
  undefined4 in_stack_fffffffffffffdfc;
  undefined4 in_stack_fffffffffffffe00;
  undefined4 in_stack_fffffffffffffe04;
  undefined4 uVar14;
  __normal_iterator<stKeyPressData<short>_*,_std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>_>
  local_1d0;
  vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_> *local_1c8;
  TClusterId *local_1c0;
  reference local_1b8;
  stKeyPressData<short> *local_1b0;
  __normal_iterator<stKeyPressData<short>_*,_std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>_>
  local_1a8;
  vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_> *local_1a0;
  double local_198;
  int local_18c;
  uint local_188;
  uint local_184;
  TValueCC *local_180;
  uint local_178;
  int local_174;
  undefined8 local_170;
  TSimilarityMap *in_stack_fffffffffffffe98;
  TKeyPressCollectionT<short> *in_stack_fffffffffffffea0;
  int32_t offsetFromPeak_samples;
  int32_t in_stack_fffffffffffffeb0;
  int32_t in_stack_fffffffffffffeb4;
  allocator<char> local_131;
  string local_130 [8];
  TKeyPressCollection *in_stack_fffffffffffffed8;
  TSimilarityMap *in_stack_fffffffffffffee0;
  __normal_iterator<stKeyPressData<short>_*,_std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>_>
  local_e8;
  vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_> *local_e0;
  undefined8 local_d8;
  stWaveformView<short> local_d0;
  undefined8 local_c0;
  vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_> local_88;
  undefined4 local_68;
  allocator<char> local_61;
  string local_60 [48];
  vector<short,_std::allocator<short>_> local_30;
  long local_18;
  undefined8 *local_10;
  undefined4 uVar15;
  int iVar16;
  
  uVar15 = 0;
  local_10 = in_RSI;
  tVar3 = time((time_t *)0x0);
  srand((uint)tVar3);
  printf("Usage: %s record.kbd\n",*local_10);
  if (in_EDI < 2) {
    iVar16 = -1;
  }
  else {
    local_18 = 24000;
    std::vector<short,_std::allocator<short>_>::vector
              ((vector<short,_std::allocator<short>_> *)0x12d13d);
    printf("[+] Loading recording from \'%s\'\n",local_10[1]);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
               (char *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
               (allocator<char> *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
    bVar1 = readFromFile<float,short>(in_stack_00000018,in_stack_00000010);
    uVar14 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffe04);
    uVar2 = (uint)bVar1;
    std::__cxx11::string::~string(local_60);
    std::allocator<char>::~allocator(&local_61);
    if (uVar2 == 0) {
      printf("Specified file \'%s\' does not exist\n",local_10[1]);
      iVar16 = -1;
      local_68 = 1;
    }
    else {
      sVar4 = std::vector<short,_std::allocator<short>_>::size(&local_30);
      printf("[+] Loaded recording: of %d samples (sample size = %d bytes)\n",sVar4 & 0xffffffff,2);
      sVar4 = std::vector<short,_std::allocator<short>_>::size(&local_30);
      fVar10 = (float)(long)(sVar4 * 2);
      fVar9 = (float)(sVar4 & 0x7fffffffffffffff) + (float)(sVar4 & 0x7fffffffffffffff);
      if (-1 < (long)(sVar4 * 2)) {
        fVar9 = fVar10;
      }
      printf("    Size in memory:          %g MB\n",(double)(fVar9 * 0.0009765625 * 0.0009765625));
      printf("    Sample size:             %d\n",2);
      sVar4 = std::vector<short,_std::allocator<short>_>::size(&local_30);
      printf("    Total number of samples: %d\n",sVar4 & 0xffffffff);
      sVar4 = std::vector<short,_std::allocator<short>_>::size(&local_30);
      fVar11 = (float)(long)sVar4;
      fVar13 = (float)sVar4;
      printf("    Recording length:        %g seconds\n",(double)(fVar13 / (float)local_18));
      stKeyPressCollection<short>::stKeyPressCollection(in_stack_fffffffffffffdc0);
      std::vector<short,_std::allocator<short>_>::vector
                ((vector<short,_std::allocator<short>_> *)0x12d3d5);
      std::vector<short,_std::allocator<short>_>::vector
                ((vector<short,_std::allocator<short>_> *)0x12d3e2);
      local_c0 = std::chrono::_V2::system_clock::now();
      printf("[+] Searching for key presses\n");
      local_d0 = getView<short>((TWaveformT<short> *)in_stack_fffffffffffffdc0,
                                CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
      uVar12 = 1;
      bVar1 = findKeyPresses<short>
                        ((TWaveformViewT<short> *)__range1_2,
                         (TKeyPressCollectionT<short> *)__begin1_2._M_current,
                         (TWaveformT<short> *)__end1_2._M_current,(TWaveformT<short> *)k_2,
                         (double)cid_1,in_stack_0000005c,in_stack_00000058,in_stack_00000057);
      if (bVar1) {
        local_d8 = std::chrono::_V2::system_clock::now();
        sVar4 = std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>::size
                          (&local_88);
        printf("[+] Detected a total of %d potential key presses\n",sVar4 & 0xffffffff);
        local_e0 = &local_88;
        local_e8._M_current =
             (stKeyPressData<short> *)
             std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>::begin
                       ((vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_> *)
                        CONCAT44(in_stack_fffffffffffffdbc,uVar12));
        std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>::end
                  ((vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_> *)
                   CONCAT44(in_stack_fffffffffffffdbc,uVar12));
        while( true ) {
          bVar1 = __gnu_cxx::operator!=
                            ((__normal_iterator<stKeyPressData<short>_*,_std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>_>
                              *)in_stack_fffffffffffffdc0,
                             (__normal_iterator<stKeyPressData<short>_*,_std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>_>
                              *)CONCAT44(in_stack_fffffffffffffdbc,uVar12));
          if (!bVar1) break;
          psVar7 = __gnu_cxx::
                   __normal_iterator<stKeyPressData<short>_*,_std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>_>
                   ::operator*(&local_e8);
          printf("    position - %d\n",(ulong)(uint)psVar7->pos);
          __gnu_cxx::
          __normal_iterator<stKeyPressData<short>_*,_std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>_>
          ::operator++(&local_e8);
        }
        t1.__d.__r._4_4_ = in_stack_fffffffffffffdcc;
        t1.__d.__r._0_4_ = in_stack_fffffffffffffdc8;
        fVar8 = toSeconds<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>
                          (in_stack_fffffffffffffdd0,t1);
        printf("[+] Search took %4.3f seconds\n",(double)fVar8);
        in_stack_fffffffffffffdd0.__d.__r = (duration)&local_131;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(uVar14,uVar2),(char *)CONCAT44(fVar9,fVar10),
                   (allocator<char> *)CONCAT44(fVar13,fVar11));
        dumpKeyPresses<short>(unaff_retaddr,(TKeyPressCollectionT<short> *)CONCAT44(uVar15,in_EDI));
        std::__cxx11::string::~string(local_130);
        std::allocator<char>::~allocator(&local_131);
        std::
        vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
        ::vector((vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
                  *)0x12d667);
        std::chrono::_V2::system_clock::now();
        offsetFromPeak_samples = extraout_var;
        printf("[+] Calculating CC similarity map\n");
        bVar1 = calculateSimilartyMap<short>
                          (in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0,
                           offsetFromPeak_samples,in_stack_fffffffffffffea0,
                           in_stack_fffffffffffffe98);
        uVar15 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffdcc);
        if (bVar1) {
          local_170 = std::chrono::_V2::system_clock::now();
          t1_00.__d.__r._4_4_ = uVar15;
          t1_00.__d.__r._0_4_ = in_stack_fffffffffffffdc8;
          fVar9 = toSeconds<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>
                            (in_stack_fffffffffffffdd0,t1_00);
          printf("[+] Calculation took %4.3f seconds\n",(double)fVar9);
          sVar4 = std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>::size
                            (&local_88);
          local_174 = (int)sVar4;
          for (local_178 = 0; (int)local_178 < local_174; local_178 = local_178 + 1) {
            pvVar5 = std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>::
                     operator[](&local_88,(long)(int)local_178);
            local_180 = &pvVar5->ccAvg;
            printf("    Average CC for keypress %4d - %6.3f\n",*local_180,(ulong)local_178);
          }
          printf("%5d ",0xffffffff);
          for (local_184 = 0; (int)local_184 < local_174; local_184 = local_184 + 1) {
            printf("%4d ",(ulong)local_184);
          }
          printf("\n");
          printf(
                "--------------------------------------------------------------------------------------------------------------------------------------\n"
                );
          for (local_188 = 0; (int)local_188 < local_174; local_188 = local_188 + 1) {
            printf("%2d  | ",(ulong)local_188);
            for (local_18c = 0; local_18c < local_174; local_18c = local_18c + 1) {
              this = std::
                     vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
                     ::operator[]((vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
                                   *)&stack0xfffffffffffffeb0,(long)(int)local_188);
              pvVar6 = std::vector<stMatch,_std::allocator<stMatch>_>::operator[]
                                 (this,(long)local_18c);
              local_198 = pvVar6->cc;
              if (local_198 <= -0.45) {
                printf("     ");
              }
              else {
                printf("%4.0f ",local_198 * 100.0);
              }
            }
            printf("\n");
          }
          printf("\n");
          clusterG(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
          local_1a0 = &local_88;
          local_1a8._M_current =
               (stKeyPressData<short> *)
               std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>::begin
                         ((vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_> *)
                          CONCAT44(in_stack_fffffffffffffdbc,uVar12));
          local_1b0 = (stKeyPressData<short> *)
                      std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>::
                      end((vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_> *)
                          CONCAT44(in_stack_fffffffffffffdbc,uVar12));
          while( true ) {
            bVar1 = __gnu_cxx::operator!=
                              ((__normal_iterator<stKeyPressData<short>_*,_std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>_>
                                *)in_stack_fffffffffffffdc0,
                               (__normal_iterator<stKeyPressData<short>_*,_std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>_>
                                *)CONCAT44(in_stack_fffffffffffffdbc,uVar12));
            if (!bVar1) break;
            local_1b8 = __gnu_cxx::
                        __normal_iterator<stKeyPressData<short>_*,_std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>_>
                        ::operator*(&local_1a8);
            local_1c0 = &local_1b8->cid;
            printf("%d ",(ulong)(uint)*local_1c0);
            __gnu_cxx::
            __normal_iterator<stKeyPressData<short>_*,_std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>_>
            ::operator++(&local_1a8);
          }
          printf("\n");
          local_1c8 = &local_88;
          local_1d0._M_current =
               (stKeyPressData<short> *)
               std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>::begin
                         ((vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_> *)
                          CONCAT44(in_stack_fffffffffffffdbc,uVar12));
          std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>::end
                    ((vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_> *)
                     CONCAT44(in_stack_fffffffffffffdbc,uVar12));
          while( true ) {
            bVar1 = __gnu_cxx::operator!=
                              ((__normal_iterator<stKeyPressData<short>_*,_std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>_>
                                *)in_stack_fffffffffffffdc0,
                               (__normal_iterator<stKeyPressData<short>_*,_std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>_>
                                *)CONCAT44(in_stack_fffffffffffffdbc,uVar12));
            if (!bVar1) break;
            psVar7 = __gnu_cxx::
                     __normal_iterator<stKeyPressData<short>_*,_std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>_>
                     ::operator*(&local_1d0);
            printf("%c",(ulong)(psVar7->cid + 0x60));
            __gnu_cxx::
            __normal_iterator<stKeyPressData<short>_*,_std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>_>
            ::operator++(&local_1d0);
          }
          printf("\n");
          iVar16 = 0;
        }
        else {
          printf("Failed to calculate similariy map\n");
          iVar16 = -3;
        }
        local_68 = 1;
        std::
        vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
        ::~vector((vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
                   *)in_stack_fffffffffffffdd0.__d.__r);
      }
      else {
        printf("Failed to detect keypresses\n");
        iVar16 = -2;
        local_68 = 1;
      }
      std::vector<short,_std::allocator<short>_>::~vector
                ((vector<short,_std::allocator<short>_> *)in_stack_fffffffffffffdd0.__d.__r);
      std::vector<short,_std::allocator<short>_>::~vector
                ((vector<short,_std::allocator<short>_> *)in_stack_fffffffffffffdd0.__d.__r);
      stKeyPressCollection<short>::~stKeyPressCollection((stKeyPressCollection<short> *)0x12db9b);
    }
    std::vector<short,_std::allocator<short>_>::~vector
              ((vector<short,_std::allocator<short>_> *)in_stack_fffffffffffffdd0.__d.__r);
  }
  return iVar16;
}

Assistant:

int main(int argc, char ** argv) {
    srand(time(0));

    printf("Usage: %s record.kbd\n", argv[0]);
    if (argc < 2) {
        return -1;
    }

    int64_t sampleRate = 24000;

    TWaveform waveformInput;
    printf("[+] Loading recording from '%s'\n", argv[1]);
    if (readFromFile<TSampleF>(argv[1], waveformInput) == false) {
        printf("Specified file '%s' does not exist\n", argv[1]);
        return -1;
    }

    //{
    //    std::ofstream fout("waveform.plot");
    //    for (auto & a : waveformInput) {
    //        fout << a << std::endl;
    //    }
    //    fout.close();
    //}

    printf("[+] Loaded recording: of %d samples (sample size = %d bytes)\n", (int) waveformInput.size(), (int) sizeof(TSample));
    printf("    Size in memory:          %g MB\n", (float)(sizeof(TSample)*waveformInput.size())/1024/1024);
    printf("    Sample size:             %d\n", (int) sizeof(TSample));
    printf("    Total number of samples: %d\n", (int) waveformInput.size());
    printf("    Recording length:        %g seconds\n", (float)(waveformInput.size())/sampleRate);

    TKeyPressCollection keyPresses;
    TWaveform waveformThreshold;
    TWaveform waveformMax;
    {
        auto tStart = std::chrono::high_resolution_clock::now();
        printf("[+] Searching for key presses\n");
        if (findKeyPresses(getView(waveformInput, 0), keyPresses, waveformThreshold, waveformMax, 8.0, 512, 2*1024, true) == false) {
            printf("Failed to detect keypresses\n");
            return -2;
        }
        auto tEnd = std::chrono::high_resolution_clock::now();
        printf("[+] Detected a total of %d potential key presses\n", (int) keyPresses.size());
        for (auto & k : keyPresses) {
            auto & pos = k.pos;

            printf("    position - %d\n", (int) pos);
        }
        printf("[+] Search took %4.3f seconds\n", toSeconds(tStart, tEnd));

        dumpKeyPresses("key_presses.plot", keyPresses);
    }

    //keyPresses.erase(keyPresses.begin(), keyPresses.begin() + keyPresses.size()/2);

    TSimilarityMap similarityMap;
    {
        auto tStart = std::chrono::high_resolution_clock::now();
        printf("[+] Calculating CC similarity map\n");
        if (calculateSimilartyMap(256, 256, 0, keyPresses, similarityMap) == false) {
            printf("Failed to calculate similariy map\n");
            return -3;
        }
        auto tEnd = std::chrono::high_resolution_clock::now();
        printf("[+] Calculation took %4.3f seconds\n", toSeconds(tStart, tEnd));
    }

    int n = keyPresses.size();
    for (int i = 0; i < n; ++i) {
        auto & avgcc = keyPresses[i].ccAvg;

        printf("    Average CC for keypress %4d - %6.3f\n", i, avgcc);
    }

    printf("%5d ", -1);
    for (int j = 0; j < n; ++j) {
        printf("%4d ", j);
    }
    printf("\n");
    printf("--------------------------------------------------------------------------------------------------------------------------------------\n");

    for (int i = 0; i < n; ++i) {
        printf("%2d  | ", i);
        for (int j = 0; j < n; ++j) {
            auto cc     = similarityMap[i][j].cc;
            //auto offset = similarityMap[i][j].offset;

            if (cc > -0.45) {
                printf("%4.0f ", cc*100);
            } else {
                printf("     ");
            }
            //printf("%3d - %3d -> %4.3f, %3d\n", i, j, cc, (int) offset);
        }
        printf("\n");
    }

    printf("\n");

    //clusterDBSCAN(similarityMap, 0.8, 1, keyPresses);
    //clusterSimple(similarityMap, 0.50, keyPresses);
    clusterG(similarityMap, keyPresses);

    for (const auto & k : keyPresses) {
        auto & cid = k.cid;

        //printf("%c", 'a' + cid - 1);
        printf("%d ", cid);
    }
    printf("\n");

    for (const auto & k : keyPresses) {
        auto & cid = k.cid;

        printf("%c", 'a' + cid - 1);
    }
    printf("\n");

    return 0;
}